

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

void __thiscall GrammarLexer::popFile(GrammarLexer *this)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *ppbVar3;
  value_type local_14;
  GrammarLexer *pGStack_10;
  int4 filenum;
  GrammarLexer *this_local;
  
  pGStack_10 = this;
  std::vector<int,_std::allocator<int>_>::pop_back(&this->filestack);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->filestack);
  if (bVar1) {
    this->endoffile = true;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::back(&this->filestack);
    local_14 = *pvVar2;
    ppbVar3 = std::
              map<int,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::basic_istream<char,_std::char_traits<char>_>_*>_>_>
              ::operator[](&this->streammap,&local_14);
    this->in = *ppbVar3;
  }
  return;
}

Assistant:

void GrammarLexer::popFile(void)

{
  filestack.pop_back();
  if (filestack.empty()) {
    endoffile = true;
    return;
  }
  int4 filenum = filestack.back();
  in = streammap[filenum];	// Get previous stream
}